

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O3

Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* Program::create(Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *__return_storage_ptr__,string *fragment_src,string *vertex_src)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  uint uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Alloc_hider _Var5;
  Handle handle;
  GLint linked;
  Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  vertex_result;
  Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  fragment_result;
  GLsizei length;
  char info [2048];
  Handle local_8c8;
  int local_8c4;
  undefined1 local_8c0 [32];
  bool local_8a0;
  undefined1 local_898 [32];
  bool local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  undefined4 local_84c;
  string local_848;
  _Alloc_hider local_828 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_818 [127];
  
  uVar3 = glCreateProgram();
  local_8c8.name_ = uVar3;
  if (uVar3 == 0) {
    local_8c0._0_8_ = local_8c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_8c0,"Cannot create program","");
  }
  else {
    if ((vertex_src->_M_string_length != 0) && (fragment_src->_M_string_length != 0)) {
      anon_unknown.dwarf_81ef0::Shader::create
                ((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_8c0,0x8b31,vertex_src);
      if (local_8a0 == false) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_898,"Cannot compile vertex shader: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_8c0);
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)CONCAT44(local_898._4_4_,local_898._0_4_);
        _Var5._M_p = (pointer)paVar4;
        if (paVar4 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_898 + 0x10)) {
          local_818[0]._8_8_ = local_898._24_8_;
          paVar4 = local_818;
          _Var5._M_p = local_828[0]._M_p;
        }
        local_828[0]._M_p = _Var5._M_p;
        paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&__return_storage_ptr__->field_0 = paVar1;
        if (paVar4 == local_818) {
          paVar1->_M_allocated_capacity = local_898._16_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
               local_818[0]._8_8_;
        }
        else {
          (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = (pointer)paVar4;
          (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
               local_898._16_8_;
        }
        (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_898._8_8_;
        __return_storage_ptr__->has_value_ = false;
      }
      else {
        anon_unknown.dwarf_81ef0::Shader::create
                  ((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_898,0x8b30,fragment_src);
        if (local_878 == false) {
          std::operator+(&local_870,"Cannot compile fragment shader: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_898);
          paVar4 = local_818;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_870._M_dataplus._M_p == &local_870.field_2) {
            local_818[0]._M_allocated_capacity = local_870.field_2._M_allocated_capacity;
            local_818[0]._8_8_ = local_870.field_2._8_8_;
            _Var5._M_p = (pointer)paVar4;
          }
          else {
            local_828[0]._M_p = local_870._M_dataplus._M_p;
            local_818[0]._M_allocated_capacity = local_870.field_2._M_allocated_capacity;
            _Var5._M_p = local_870._M_dataplus._M_p;
          }
          (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
               (pointer)((long)&__return_storage_ptr__->field_0 + 0x10);
          local_848._M_string_length = local_870._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var5._M_p != paVar4) {
            (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = _Var5._M_p;
            goto LAB_00126b23;
          }
LAB_00126b29:
          uVar2 = *(undefined8 *)(paVar4->_M_local_buf + 8);
          (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
               paVar4->_M_allocated_capacity;
          *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
               uVar2;
LAB_00126b2f:
          (__return_storage_ptr__->field_0).error_.error_._M_string_length =
               local_848._M_string_length;
          __return_storage_ptr__->has_value_ = false;
        }
        else {
          if (local_8a0 == false) {
            aAppDebugPrintf("[CRASH] Unexpected");
            aAppTerminate(-1);
          }
          glAttachShader(uVar3,local_8c0._0_8_ & 0xffffffff);
          if (local_878 == false) {
            aAppDebugPrintf("[CRASH] Unexpected");
            aAppTerminate(-1);
          }
          glAttachShader(uVar3,local_898._0_4_);
          glLinkProgram(uVar3);
          local_8c4 = 0;
          glGetProgramiv(uVar3,0x8b82);
          if (local_8c4 != 1) {
            local_84c = 0;
            glGetProgramInfoLog(uVar3,0x800,&local_84c,local_828);
            format_abi_cxx11_(&local_848,"Program link error: %s",local_828);
            paVar4 = &local_870.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_848._M_dataplus._M_p == &local_848.field_2) {
              local_870.field_2._M_allocated_capacity = local_848.field_2._M_allocated_capacity;
              local_870.field_2._8_8_ = local_848.field_2._8_8_;
              local_848._M_dataplus._M_p = (pointer)paVar4;
            }
            else {
              local_870._M_dataplus._M_p = local_848._M_dataplus._M_p;
              local_870.field_2._M_allocated_capacity = local_848.field_2._M_allocated_capacity;
            }
            local_870.field_2._M_allocated_capacity = local_848.field_2._M_allocated_capacity;
            (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                 (pointer)((long)&__return_storage_ptr__->field_0 + 0x10);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_848._M_dataplus._M_p == paVar4) goto LAB_00126b29;
            (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
                 local_848._M_dataplus._M_p;
LAB_00126b23:
            (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
                 local_870.field_2._M_allocated_capacity;
            goto LAB_00126b2f;
          }
          aAppDebugPrintf("Built program %u",(ulong)uVar3);
          local_8c8.name_ = 0;
          *(uint *)&__return_storage_ptr__->field_0 = uVar3;
          local_828[0]._M_p = local_828[0]._M_p & 0xffffffff00000000;
          __return_storage_ptr__->has_value_ = true;
          Handle::~Handle((Handle *)local_828);
        }
        Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Expected((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_898);
      }
      Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_8c0);
      goto LAB_00126b4b;
    }
    local_8c0._0_8_ = local_8c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_8c0,"Empty shader sources","");
  }
  if ((undefined1 *)local_8c0._0_8_ == local_8c0 + 0x10) {
    local_818[0]._8_8_ = local_8c0._24_8_;
    _Var5._M_p = (pointer)local_818;
  }
  else {
    local_828[0]._M_p = (pointer)local_8c0._0_8_;
    _Var5._M_p = (pointer)local_8c0._0_8_;
  }
  paVar4 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)&__return_storage_ptr__->field_0 = paVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p == local_818) {
    paVar4->_M_allocated_capacity = local_8c0._16_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
         local_818[0]._8_8_;
  }
  else {
    (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = _Var5._M_p;
    (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity = local_8c0._16_8_
    ;
  }
  (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_8c0._8_8_;
  __return_storage_ptr__->has_value_ = false;
LAB_00126b4b:
  Handle::~Handle(&local_8c8);
  return __return_storage_ptr__;
}

Assistant:

Expected<Program,std::string> Program::create(const std::string& fragment_src, const std::string &vertex_src) {
	Handle handle(glCreateProgram());
	if (!handle.name())
		return Unexpected(std::string("Cannot create program"));

	if (vertex_src.empty() || fragment_src.empty())
		return Unexpected(std::string("Empty shader sources"));

	auto vertex_result = Shader::create(GL_VERTEX_SHADER, vertex_src);
	if (!vertex_result.hasValue())
		return Unexpected("Cannot compile vertex shader: " + vertex_result.error());

	auto fragment_result = Shader::create(GL_FRAGMENT_SHADER, fragment_src);
	if (!fragment_result.hasValue())
		return Unexpected("Cannot compile fragment shader: " + fragment_result.error());

	glAttachShader(handle.name(), vertex_result->name());
	glAttachShader(handle.name(), fragment_result->name());

	glLinkProgram(handle.name());

	GLint linked = GL_FALSE;
	glGetProgramiv(handle.name(), GL_LINK_STATUS, &linked);
	if (linked != GL_TRUE) {
		GLsizei length = 0;
		char info[2048];
		glGetProgramInfoLog(handle.name(), COUNTOF(info), &length, info);
		return Unexpected(format("Program link error: %s", info));
	}

	MSG("Built program %u", handle.name());
	return Program(std::move(handle));
}